

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTF2Importer.cpp
# Opt level: O1

aiMaterial *
ImportMaterial(vector<int,_std::allocator<int>_> *embeddedTexIdxs,Asset *r,Material *mat)

{
  ulong uVar1;
  vector<glTF2::Texture_*,_std::allocator<glTF2::Texture_*>_> *pvVar2;
  aiMaterial *this;
  size_t sVar3;
  float glossinessAsShininess;
  aiString alphaMode;
  float local_44c;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined1 local_438 [8];
  float fStack_430;
  undefined4 uStack_42c;
  
  this = (aiMaterial *)operator_new(0x10);
  aiMaterial::aiMaterial(this);
  uVar1 = (mat->super_Object).name._M_string_length;
  if (uVar1 != 0) {
    sVar3 = 0x3ff;
    if ((uVar1 & 0xfffffc00) == 0) {
      sVar3 = uVar1 & 0xffffffff;
    }
    local_438._0_4_ = (ai_uint32)sVar3;
    memcpy(local_438 + 4,(mat->super_Object).name._M_dataplus._M_p,sVar3);
    local_438[sVar3 + 4] = 0;
    aiMaterial::AddProperty(this,(aiString *)local_438,"?mat.name",0,0);
  }
  local_438 = *(undefined1 (*) [8])(mat->pbrMetallicRoughness).baseColorFactor;
  _fStack_430 = *(undefined8 *)((mat->pbrMetallicRoughness).baseColorFactor + 2);
  aiMaterial::AddBinaryProperty(this,local_438,0x10,"$clr.diffuse",0,0,aiPTI_Float);
  local_438 = *(undefined1 (*) [8])(mat->pbrMetallicRoughness).baseColorFactor;
  _fStack_430 = *(undefined8 *)((mat->pbrMetallicRoughness).baseColorFactor + 2);
  aiMaterial::AddBinaryProperty
            (this,local_438,0x10,"$mat.gltf.pbrMetallicRoughness.baseColorFactor",0,0,aiPTI_Float);
  SetMaterialTextureProperty
            (embeddedTexIdxs,r,(mat->pbrMetallicRoughness).baseColorTexture,this,
             aiTextureType_DIFFUSE,0);
  SetMaterialTextureProperty
            (embeddedTexIdxs,r,(mat->pbrMetallicRoughness).baseColorTexture,this,
             aiTextureType_DIFFUSE,1);
  SetMaterialTextureProperty
            (embeddedTexIdxs,r,(mat->pbrMetallicRoughness).metallicRoughnessTexture,this,
             aiTextureType_UNKNOWN,0);
  aiMaterial::AddBinaryProperty
            (this,&(mat->pbrMetallicRoughness).metallicFactor,4,
             "$mat.gltf.pbrMetallicRoughness.metallicFactor",0,0,aiPTI_Float);
  aiMaterial::AddBinaryProperty
            (this,&(mat->pbrMetallicRoughness).roughnessFactor,4,
             "$mat.gltf.pbrMetallicRoughness.roughnessFactor",0,0,aiPTI_Float);
  local_44c = 1.0 - (mat->pbrMetallicRoughness).roughnessFactor;
  local_44c = local_44c * 1000.0 * local_44c;
  aiMaterial::AddBinaryProperty(this,&local_44c,4,"$mat.shininess",0,0,aiPTI_Float);
  SetMaterialTextureProperty
            (embeddedTexIdxs,r,(mat->normalTexture).super_TextureInfo,this,aiTextureType_NORMALS,0);
  pvVar2 = (mat->normalTexture).super_TextureInfo.texture.vector;
  if ((pvVar2 != (vector<glTF2::Texture_*,_std::allocator<glTF2::Texture_*>_> *)0x0) &&
     (*(long *)(*(long *)((long)(pvVar2->
                                super__Vector_base<glTF2::Texture_*,_std::allocator<glTF2::Texture_*>_>
                                )._M_impl.super__Vector_impl_data._M_start +
                         (ulong)(mat->normalTexture).super_TextureInfo.texture.index * 8) + 0x60) !=
      0)) {
    aiMaterial::AddBinaryProperty(this,&(mat->normalTexture).scale,4,"$tex.scale",6,0,aiPTI_Float);
  }
  SetMaterialTextureProperty
            (embeddedTexIdxs,r,(mat->occlusionTexture).super_TextureInfo,this,aiTextureType_LIGHTMAP
             ,0);
  pvVar2 = (mat->occlusionTexture).super_TextureInfo.texture.vector;
  if ((pvVar2 != (vector<glTF2::Texture_*,_std::allocator<glTF2::Texture_*>_> *)0x0) &&
     (*(long *)(*(long *)((long)(pvVar2->
                                super__Vector_base<glTF2::Texture_*,_std::allocator<glTF2::Texture_*>_>
                                )._M_impl.super__Vector_impl_data._M_start +
                         (ulong)(mat->occlusionTexture).super_TextureInfo.texture.index * 8) + 0x60)
      != 0)) {
    aiMaterial::AddBinaryProperty
              (this,&(mat->occlusionTexture).strength,4,"$tex.strength",10,0,aiPTI_Float);
  }
  SetMaterialTextureProperty(embeddedTexIdxs,r,mat->emissiveTexture,this,aiTextureType_EMISSIVE,0);
  local_438._0_4_ = mat->emissiveFactor[0];
  local_438._4_4_ = mat->emissiveFactor[1];
  uStack_42c = 0x3f800000;
  fStack_430 = mat->emissiveFactor[2];
  aiMaterial::AddBinaryProperty(this,local_438,0x10,"$clr.emissive",0,0,aiPTI_Float);
  aiMaterial::AddBinaryProperty(this,&mat->doubleSided,1,"$mat.twosided",0,0,aiPTI_Buffer);
  uVar1 = (mat->alphaMode)._M_string_length;
  sVar3 = 0x3ff;
  if ((uVar1 & 0xfffffc00) == 0) {
    sVar3 = uVar1 & 0xffffffff;
  }
  local_438._0_4_ = (ai_uint32)sVar3;
  memcpy(local_438 + 4,(mat->alphaMode)._M_dataplus._M_p,sVar3);
  local_438[sVar3 + 4] = 0;
  aiMaterial::AddProperty(this,(aiString *)local_438,"$mat.gltf.alphaMode",0,0);
  aiMaterial::AddBinaryProperty(this,&mat->alphaCutoff,4,"$mat.gltf.alphaCutoff",0,0,aiPTI_Float);
  if ((mat->pbrSpecularGlossiness).isPresent == true) {
    aiMaterial::AddBinaryProperty
              (this,&(mat->pbrSpecularGlossiness).isPresent,1,"$mat.gltf.pbrSpecularGlossiness",0,0,
               aiPTI_Buffer);
    local_448 = *(undefined8 *)(mat->pbrSpecularGlossiness).value.diffuseFactor;
    uStack_440 = *(undefined8 *)((mat->pbrSpecularGlossiness).value.diffuseFactor + 2);
    aiMaterial::AddBinaryProperty(this,&local_448,0x10,"$clr.diffuse",0,0,aiPTI_Float);
    local_448._0_4_ = (mat->pbrSpecularGlossiness).value.specularFactor[0];
    local_448._4_4_ = (mat->pbrSpecularGlossiness).value.specularFactor[1];
    uStack_440 = CONCAT44(0x3f800000,(mat->pbrSpecularGlossiness).value.specularFactor[2]);
    aiMaterial::AddBinaryProperty(this,&local_448,0x10,"$clr.specular",0,0,aiPTI_Float);
    local_448 = CONCAT44(local_448._4_4_,
                         (mat->pbrSpecularGlossiness).value.glossinessFactor * 1000.0);
    aiMaterial::AddBinaryProperty(this,&local_448,4,"$mat.shininess",0,0,aiPTI_Float);
    aiMaterial::AddBinaryProperty
              (this,&(mat->pbrSpecularGlossiness).value.glossinessFactor,4,
               "$mat.gltf.pbrMetallicRoughness.glossinessFactor",0,0,aiPTI_Float);
    SetMaterialTextureProperty
              (embeddedTexIdxs,r,(mat->pbrSpecularGlossiness).value.diffuseTexture,this,
               aiTextureType_DIFFUSE,0);
    SetMaterialTextureProperty
              (embeddedTexIdxs,r,(mat->pbrSpecularGlossiness).value.specularGlossinessTexture,this,
               aiTextureType_SPECULAR,0);
  }
  if (mat->unlit == true) {
    aiMaterial::AddBinaryProperty(this,&mat->unlit,1,"$mat.gltf.unlit",0,0,aiPTI_Buffer);
  }
  return this;
}

Assistant:

static aiMaterial* ImportMaterial(std::vector<int>& embeddedTexIdxs, Asset& r, Material& mat)
{
    aiMaterial* aimat = new aiMaterial();

   if (!mat.name.empty()) {
        aiString str(mat.name);

        aimat->AddProperty(&str, AI_MATKEY_NAME);
    }

    SetMaterialColorProperty(r, mat.pbrMetallicRoughness.baseColorFactor, aimat, AI_MATKEY_COLOR_DIFFUSE);
    SetMaterialColorProperty(r, mat.pbrMetallicRoughness.baseColorFactor, aimat, AI_MATKEY_GLTF_PBRMETALLICROUGHNESS_BASE_COLOR_FACTOR);

    SetMaterialTextureProperty(embeddedTexIdxs, r, mat.pbrMetallicRoughness.baseColorTexture, aimat, aiTextureType_DIFFUSE);
    SetMaterialTextureProperty(embeddedTexIdxs, r, mat.pbrMetallicRoughness.baseColorTexture, aimat, AI_MATKEY_GLTF_PBRMETALLICROUGHNESS_BASE_COLOR_TEXTURE);

    SetMaterialTextureProperty(embeddedTexIdxs, r, mat.pbrMetallicRoughness.metallicRoughnessTexture, aimat, AI_MATKEY_GLTF_PBRMETALLICROUGHNESS_METALLICROUGHNESS_TEXTURE);

    aimat->AddProperty(&mat.pbrMetallicRoughness.metallicFactor, 1, AI_MATKEY_GLTF_PBRMETALLICROUGHNESS_METALLIC_FACTOR);
    aimat->AddProperty(&mat.pbrMetallicRoughness.roughnessFactor, 1, AI_MATKEY_GLTF_PBRMETALLICROUGHNESS_ROUGHNESS_FACTOR);

    float roughnessAsShininess = 1 - mat.pbrMetallicRoughness.roughnessFactor;
    roughnessAsShininess *= roughnessAsShininess * 1000;
    aimat->AddProperty(&roughnessAsShininess, 1, AI_MATKEY_SHININESS);

    SetMaterialTextureProperty(embeddedTexIdxs, r, mat.normalTexture, aimat, aiTextureType_NORMALS);
    SetMaterialTextureProperty(embeddedTexIdxs, r, mat.occlusionTexture, aimat, aiTextureType_LIGHTMAP);
    SetMaterialTextureProperty(embeddedTexIdxs, r, mat.emissiveTexture, aimat, aiTextureType_EMISSIVE);
    SetMaterialColorProperty(r, mat.emissiveFactor, aimat, AI_MATKEY_COLOR_EMISSIVE);

    aimat->AddProperty(&mat.doubleSided, 1, AI_MATKEY_TWOSIDED);

    aiString alphaMode(mat.alphaMode);
    aimat->AddProperty(&alphaMode, AI_MATKEY_GLTF_ALPHAMODE);
    aimat->AddProperty(&mat.alphaCutoff, 1, AI_MATKEY_GLTF_ALPHACUTOFF);

    //pbrSpecularGlossiness
    if (mat.pbrSpecularGlossiness.isPresent) {
        PbrSpecularGlossiness &pbrSG = mat.pbrSpecularGlossiness.value;

        aimat->AddProperty(&mat.pbrSpecularGlossiness.isPresent, 1, AI_MATKEY_GLTF_PBRSPECULARGLOSSINESS);
        SetMaterialColorProperty(r, pbrSG.diffuseFactor, aimat, AI_MATKEY_COLOR_DIFFUSE);
        SetMaterialColorProperty(r, pbrSG.specularFactor, aimat, AI_MATKEY_COLOR_SPECULAR);

        float glossinessAsShininess = pbrSG.glossinessFactor * 1000.0f;
        aimat->AddProperty(&glossinessAsShininess, 1, AI_MATKEY_SHININESS);
        aimat->AddProperty(&pbrSG.glossinessFactor, 1, AI_MATKEY_GLTF_PBRSPECULARGLOSSINESS_GLOSSINESS_FACTOR);

        SetMaterialTextureProperty(embeddedTexIdxs, r, pbrSG.diffuseTexture, aimat, aiTextureType_DIFFUSE);

        SetMaterialTextureProperty(embeddedTexIdxs, r, pbrSG.specularGlossinessTexture, aimat, aiTextureType_SPECULAR);
    }
    if (mat.unlit) {
        aimat->AddProperty(&mat.unlit, 1, AI_MATKEY_GLTF_UNLIT);
    }

    return aimat;
}